

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_advance(Tree *this,lookup_result *r,size_t more)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  basic_substring<const_char> local_20;
  
  uVar4 = more + r->path_pos;
  r->path_pos = uVar4;
  uVar1 = (r->path).len;
  if (uVar4 <= uVar1) {
    basic_substring<const_char>::basic_substring(&local_20,(r->path).str + uVar4,uVar1 - uVar4);
    if ((local_20.len != 0) && (*local_20.str == '.')) {
      r->path_pos = r->path_pos + 1;
    }
    return;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  handle_error(0x2467aa,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

void Tree::_advance(lookup_result *r, size_t more) const
{
    r->path_pos += more;
    if(r->path.sub(r->path_pos).begins_with('.'))
        ++r->path_pos;
}